

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineArguments_setExcludeNameFilterSameParameter_Test::
~TEST_CommandLineArguments_setExcludeNameFilterSameParameter_Test
          (TEST_CommandLineArguments_setExcludeNameFilterSameParameter_Test *this)

{
  TEST_CommandLineArguments_setExcludeNameFilterSameParameter_Test *this_local;
  
  ~TEST_CommandLineArguments_setExcludeNameFilterSameParameter_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(CommandLineArguments, setExcludeNameFilterSameParameter)
{
    int argc = 2;
    const char* argv[] = { "tests.exe", "-xnname" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter nameFilter("name");
    nameFilter.invertMatching();
    CHECK_EQUAL(nameFilter, *args->getNameFilters());
}